

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeLower(SPxLPBase<double> *this,int i,double *newLower,bool scale)

{
  double dVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double dVar2;
  
  dVar1 = *newLower;
  dVar2 = dVar1;
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    ::soplex::infinity::__tls_init();
    dVar2 = *newLower;
    if (-*(double *)(in_FS_OFFSET + -8) < dVar1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x2b])(this->lp_scaler,this,i);
      dVar2 = extraout_XMM0_Qa;
    }
  }
  (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar2;
  return;
}

Assistant:

virtual void changeLower(int i, const R& newLower, bool scale = false)
   {
      if(scale && newLower > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::lower_w(i) = lp_scaler->scaleLower(*this, i, newLower);
      }
      else
         LPColSetBase<R>::lower_w(i) = newLower;

      assert(isConsistent());
   }